

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<char[82],int,char[15],char[42]>
               (ostream *out,char *fmt,char (*args) [82],int *args_1,char (*args_2) [15],
               char (*args_3) [42])

{
  long in_FS_OFFSET;
  FormatList local_78;
  FormatArg local_68;
  int *local_50;
  code *local_48;
  code *local_40;
  char (*local_38) [15];
  code *local_30;
  code *local_28;
  char (*local_20) [42];
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_args = &local_68;
  local_78.m_N = 4;
  local_68.m_formatImpl = detail::FormatArg::formatImpl<char[82]>;
  local_68.m_toIntImpl = detail::FormatArg::toIntImpl<char[82]>;
  local_48 = detail::FormatArg::formatImpl<int>;
  local_40 = detail::FormatArg::toIntImpl<int>;
  local_30 = detail::FormatArg::formatImpl<char[15]>;
  local_28 = detail::FormatArg::toIntImpl<char[15]>;
  local_18 = detail::FormatArg::formatImpl<char[42]>;
  local_10 = detail::FormatArg::toIntImpl<char[42]>;
  local_68.m_value = args;
  local_50 = args_1;
  local_38 = args_2;
  local_20 = args_3;
  vformat(out,fmt,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}